

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O2

void __thiscall flow::diagnostics::ConsoleReport::push_back(ConsoleReport *this,Message *message)

{
  Message *in_R8;
  string_view format_str;
  string_view format_str_00;
  string sStack_28;
  
  if (message->type == Warning) {
    format_str.size_ = (size_t)message;
    format_str.data_ = (char *)0xc;
    fmt::v5::format<flow::diagnostics::Message>(&sStack_28,(v5 *)"Warning: {}\n",format_str,in_R8);
    std::operator<<((ostream *)&std::cerr,(string *)&sStack_28);
  }
  else {
    this->errorCount_ = this->errorCount_ + 1;
    format_str_00.size_ = (size_t)message;
    format_str_00.data_ = (char *)0xa;
    fmt::v5::format<flow::diagnostics::Message>(&sStack_28,(v5 *)"Error: {}\n",format_str_00,in_R8);
    std::operator<<((ostream *)&std::cerr,(string *)&sStack_28);
  }
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void ConsoleReport::push_back(Message message) {
  if (message.type != Type::Warning)
    errorCount_++;

  switch (message.type) {
    case Type::Warning:
      std::cerr << fmt::format("Warning: {}\n", message);
      break;
    default:
      std::cerr << fmt::format("Error: {}\n", message);
      break;
  }
}